

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::BlitImage
          (VulkanCommandBuffer *this,VkImage srcImage,VkImageLayout srcImageLayout,VkImage dstImage,
          VkImageLayout dstImageLayout,uint32_t regionCount,VkImageBlit *pRegions,VkFilter filter)

{
  string msg;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])dstImage);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"BlitImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x237);
    std::__cxx11::string::~string((string *)&msg);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdBlitImage)(this->m_VkCmdBuffer,srcImage,srcImageLayout,dstImage,dstImageLayout,regionCount,
                    pRegions,filter);
  return;
}

Assistant:

__forceinline void BlitImage(VkImage            srcImage,
                                 VkImageLayout      srcImageLayout,
                                 VkImage            dstImage,
                                 VkImageLayout      dstImageLayout,
                                 uint32_t           regionCount,
                                 const VkImageBlit* pRegions,
                                 VkFilter           filter)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Blit must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdBlitImage(m_VkCmdBuffer, srcImage, srcImageLayout, dstImage, dstImageLayout, regionCount, pRegions, filter);
    }